

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

bool checkInterfacePropertyCompatibility<bool>
               (cmGeneratorTarget *tgt,string *p,string *config,char *defaultValue,CompatibleType t,
               bool *param_6)

{
  cmGeneratorTarget *this;
  bool bVar1;
  pointer pbVar2;
  bool bVar3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *pvVar5;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  ostream *poVar7;
  size_t sVar8;
  uint uVar9;
  pointer ppcVar10;
  int iVar11;
  char *pcVar12;
  bool bVar13;
  string reportEntry;
  string report;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  propKeys;
  ostringstream e;
  string interfaceProperty;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headPropKeys;
  uint local_2a0;
  string local_290;
  cmGeneratorTarget *local_270;
  long *local_268;
  long local_258 [2];
  string local_248;
  _Base_ptr local_228;
  _Base_ptr local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_218;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *local_210;
  char *local_208;
  pointer local_200;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  undefined1 local_1e0 [112];
  ios_base local_170 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_208 = defaultValue;
  bVar3 = cmTarget::GetPropertyAsBool(tgt->Target,p);
  local_2a0 = (uint)bVar3;
  cmGeneratorTarget::GetPropertyKeys_abi_cxx11_(&local_48,tgt);
  _Var4 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    (local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,p);
  bVar13 = _Var4._M_current !=
           local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_220 = (_Base_ptr)
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(tgt->LinkImplicitNullProperties)._M_t,p);
  local_218 = local_48.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_228 = &(tgt->LinkImplicitNullProperties)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (local_220 != local_228 &&
      _Var4._M_current !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __assert_fail("(impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmGeneratorTarget.cxx"
                  ,0x10b6,
                  "PropertyType checkInterfacePropertyCompatibility(const cmGeneratorTarget *, const std::string &, const std::string &, const char *, CompatibleType, PropertyType *) [PropertyType = bool]"
                 );
  }
  local_270 = tgt;
  pvVar5 = cmGeneratorTarget::GetLinkImplementationClosure(tgt,config);
  if ((pvVar5->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (pvVar5->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    local_210 = pvVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_248," * Target \"","");
    std::__cxx11::string::_M_append
              ((char *)&local_248,(ulong)(local_270->Target->Name)._M_dataplus._M_p);
    if (_Var4._M_current != local_218) {
      std::__cxx11::string::append((char *)&local_248);
      pcVar12 = "FALSE";
      if (bVar3) {
        pcVar12 = "TRUE";
      }
      local_1e0._0_8_ = local_1e0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1e0,pcVar12,pcVar12 + ((ulong)bVar3 ^ 5));
      std::__cxx11::string::_M_append((char *)&local_248,local_1e0._0_8_);
      if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
        operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
      }
    }
    std::__cxx11::string::append((char *)&local_248);
    std::operator+(&local_68,"INTERFACE_",p);
    ppcVar10 = (local_210->
               super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
    if (ppcVar10 !=
        (local_210->
        super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
        _M_impl.super__Vector_impl_data._M_finish) {
      do {
        this = *ppcVar10;
        local_200 = ppcVar10;
        cmGeneratorTarget::GetPropertyKeys_abi_cxx11_(&local_1f8,this);
        _Var6 = std::
                __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          (local_1f8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           local_1f8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_68);
        pbVar2 = local_1f8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        bVar3 = cmTarget::GetPropertyAsBool(this->Target,&local_68);
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
        local_290._M_string_length = 0;
        local_290.field_2._M_local_buf[0] = '\0';
        if (_Var6._M_current == pbVar2) {
          uVar9 = local_2a0;
          if (local_220 != local_228) {
            uVar9 = 0;
          }
          if (_Var4._M_current != local_218) {
            uVar9 = local_2a0;
          }
          bVar1 = false;
          local_2a0 = uVar9;
        }
        else {
          std::__cxx11::string::append((char *)&local_290);
          std::__cxx11::string::_M_append
                    ((char *)&local_290,(ulong)(this->Target->Name)._M_dataplus._M_p);
          std::__cxx11::string::append((char *)&local_290);
          pcVar12 = "FALSE";
          if (bVar3) {
            pcVar12 = "TRUE";
          }
          local_1e0._0_8_ = local_1e0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1e0,pcVar12,pcVar12 + ((ulong)bVar3 ^ 5));
          std::__cxx11::string::_M_append((char *)&local_290,local_1e0._0_8_);
          if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
            operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
          }
          std::__cxx11::string::append((char *)&local_290);
          if (_Var4._M_current == local_218) {
            if (local_220 == local_228) {
              if (bVar13) {
                std::__cxx11::string::_M_append
                          ((char *)&local_248,(ulong)local_290._M_dataplus._M_p);
                compatibilityAgree_abi_cxx11_((string *)local_1e0,t,false);
                std::__cxx11::string::_M_append((char *)&local_248,local_1e0._0_8_);
                if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
                  operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
                }
                bVar1 = false;
                bVar13 = true;
                bVar3 = bVar3 != local_2a0._0_1_;
                if (bVar3) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1e0,"The INTERFACE_",0xe);
                  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)local_1e0,(p->_M_dataplus)._M_p,p->_M_string_length
                                     );
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7," property of \"",0xe);
                  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                     (poVar7,(this->Target->Name)._M_dataplus._M_p,
                                      (this->Target->Name)._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar7,"\" does\nnot agree with the value of ",0x23);
                  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                     (poVar7,(p->_M_dataplus)._M_p,p->_M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar7," already determined\nfor \"",0x19);
                  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                     (poVar7,(local_270->Target->Name)._M_dataplus._M_p,
                                      (local_270->Target->Name)._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\".\n",3);
                  std::__cxx11::stringbuf::str();
                  cmSystemTools::Error((char *)local_268,(char *)0x0,(char *)0x0,(char *)0x0);
                  goto LAB_003ee5ea;
                }
              }
              else {
                local_1e0._0_8_ = local_1e0 + 0x10;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_1e0,local_290._M_dataplus._M_p,
                           local_290._M_dataplus._M_p + local_290._M_string_length);
                std::__cxx11::string::append((char *)local_1e0);
                std::__cxx11::string::_M_append((char *)&local_248,local_1e0._0_8_);
                if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
                  operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
                }
                bVar1 = false;
                bVar13 = true;
                local_2a0 = (uint)bVar3;
              }
            }
            else {
              std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_290._M_dataplus._M_p);
              compatibilityAgree_abi_cxx11_((string *)local_1e0,t,false);
              pcVar12 = local_208;
              std::__cxx11::string::_M_append((char *)&local_248,local_1e0._0_8_);
              if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
                operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
              }
              if (bVar3) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1e0,"Property ",9);
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_1e0,(p->_M_dataplus)._M_p,p->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7," on target \"",0xc);
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar7,(local_270->Target->Name)._M_dataplus._M_p,
                                    (local_270->Target->Name)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar7,"\" is\nimplied to be ",0x13);
                if (pcVar12 == (char *)0x0) {
                  std::ios::clear((int)poVar7 + (int)poVar7->_vptr_basic_ostream[-3]);
                }
                else {
                  sVar8 = strlen(pcVar12);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar12,sVar8);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar7,
                           " because it was used to determine the link libraries\nalready. The INTERFACE_"
                           ,0x4c);
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar7,(p->_M_dataplus)._M_p,p->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar7," property on\ndependency \"",0x19);
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar7,(this->Target->Name)._M_dataplus._M_p,
                                    (this->Target->Name)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar7,"\" is in conflict.\n",0x12);
                std::__cxx11::stringbuf::str();
                cmSystemTools::Error((char *)local_268,(char *)0x0,(char *)0x0,(char *)0x0);
                if (local_268 != local_258) {
                  operator_delete(local_268,local_258[0] + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
                std::ios_base::~ios_base(local_170);
                bVar1 = true;
              }
              else {
                bVar1 = false;
              }
              local_2a0 = 0;
            }
          }
          else {
            std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_290._M_dataplus._M_p);
            compatibilityAgree_abi_cxx11_((string *)local_1e0,t,false);
            std::__cxx11::string::_M_append((char *)&local_248,local_1e0._0_8_);
            if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
              operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
            }
            bVar1 = false;
            bVar3 = bVar3 != local_2a0._0_1_;
            if (bVar3) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e0,"Property ",9)
              ;
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1e0,(p->_M_dataplus)._M_p,p->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7," on target \"",0xc);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar7,(local_270->Target->Name)._M_dataplus._M_p,
                                  (local_270->Target->Name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar7,"\" does\nnot match the INTERFACE_",0x1f);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar7,(p->_M_dataplus)._M_p,p->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar7," property requirement\nof dependency \"",0x25);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar7,(this->Target->Name)._M_dataplus._M_p,
                                  (this->Target->Name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\".\n",3);
              std::__cxx11::stringbuf::str();
              cmSystemTools::Error((char *)local_268,(char *)0x0,(char *)0x0,(char *)0x0);
LAB_003ee5ea:
              if (local_268 != local_258) {
                operator_delete(local_268,local_258[0] + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
              std::ios_base::~ios_base(local_170);
              bVar1 = true;
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) {
          operator_delete(local_290._M_dataplus._M_p,
                          CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                                   local_290.field_2._M_local_buf[0]) + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_1f8);
      } while ((!bVar1) &&
              (ppcVar10 = local_200 + 1,
              ppcVar10 !=
              (local_210->
              super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
              )._M_impl.super__Vector_impl_data._M_finish));
    }
    iVar11 = 0x508ca9;
    if (local_2a0 != 0) {
      iVar11 = 0x50438e;
    }
    local_1e0._0_8_ = local_1e0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1e0,iVar11,(local_2a0 ^ 5) + iVar11);
    compatibilityType_abi_cxx11_(&local_290,t);
    cmGeneratorTarget::ReportPropertyOrigin(local_270,p,(string *)local_1e0,&local_248,&local_290);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,
                      CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                               local_290.field_2._M_local_buf[0]) + 1);
    }
    if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
      operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    bVar3 = local_2a0._0_1_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
  }
  local_2a0._0_1_ = bVar3;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return local_2a0._0_1_;
}

Assistant:

PropertyType checkInterfacePropertyCompatibility(cmGeneratorTarget const* tgt,
                                          const std::string &p,
                                          const std::string& config,
                                          const char *defaultValue,
                                          CompatibleType t,
                                          PropertyType *)
{
  PropertyType propContent = getTypedProperty<PropertyType>(tgt, p);
  std::vector<std::string> headPropKeys = tgt->GetPropertyKeys();
  const bool explicitlySet =
      std::find(headPropKeys.begin(), headPropKeys.end(),
                p) != headPropKeys.end();

  const bool impliedByUse =
          tgt->IsNullImpliedByLinkLibraries(p);
  assert((impliedByUse ^ explicitlySet)
      || (!impliedByUse && !explicitlySet));

  std::vector<cmGeneratorTarget const*> const& deps =
    tgt->GetLinkImplementationClosure(config);

  if(deps.empty())
    {
    return propContent;
    }
  bool propInitialized = explicitlySet;

  std::string report = " * Target \"";
  report += tgt->GetName();
  if (explicitlySet)
    {
    report += "\" has property content \"";
    report += valueAsString<PropertyType>(propContent);
    report += "\"\n";
    }
  else if (impliedByUse)
    {
    report += "\" property is implied by use.\n";
    }
  else
    {
    report += "\" property not set.\n";
    }

  std::string interfaceProperty = "INTERFACE_" + p;
  for(std::vector<cmGeneratorTarget const*>::const_iterator li =
      deps.begin();
      li != deps.end(); ++li)
    {
    // An error should be reported if one dependency
    // has INTERFACE_POSITION_INDEPENDENT_CODE ON and the other
    // has INTERFACE_POSITION_INDEPENDENT_CODE OFF, or if the
    // target itself has a POSITION_INDEPENDENT_CODE which disagrees
    // with a dependency.

    cmGeneratorTarget const* theTarget = *li;

    std::vector<std::string> propKeys = theTarget->GetPropertyKeys();

    const bool ifaceIsSet =
        std::find(propKeys.begin(), propKeys.end(),
                  interfaceProperty) != propKeys.end();
    PropertyType ifacePropContent =
                    getTypedProperty<PropertyType>(theTarget,
                              interfaceProperty);

    std::string reportEntry;
    if (ifaceIsSet)
      {
      reportEntry += " * Target \"";
      reportEntry += theTarget->GetName();
      reportEntry += "\" property value \"";
      reportEntry += valueAsString<PropertyType>(ifacePropContent);
      reportEntry += "\" ";
      }

    if (explicitlySet)
      {
      if (ifaceIsSet)
        {
        std::pair<bool, PropertyType> consistent =
                                  consistentProperty(propContent,
                                                     ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first)
          {
          std::ostringstream e;
          e << "Property " << p << " on target \""
            << tgt->GetName() << "\" does\nnot match the "
            "INTERFACE_" << p << " property requirement\nof "
            "dependency \"" << theTarget->GetName() << "\".\n";
          cmSystemTools::Error(e.str().c_str());
          break;
          }
        else
          {
          propContent = consistent.second;
          continue;
          }
        }
      else
        {
        // Explicitly set on target and not set in iface. Can't disagree.
        continue;
        }
      }
    else if (impliedByUse)
      {
      propContent = impliedValue<PropertyType>(propContent);

      if (ifaceIsSet)
        {
        std::pair<bool, PropertyType> consistent =
                                  consistentProperty(propContent,
                                                     ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first)
          {
          std::ostringstream e;
          e << "Property " << p << " on target \""
            << tgt->GetName() << "\" is\nimplied to be " << defaultValue
            << " because it was used to determine the link libraries\n"
               "already. The INTERFACE_" << p << " property on\ndependency \""
            << theTarget->GetName() << "\" is in conflict.\n";
          cmSystemTools::Error(e.str().c_str());
          break;
          }
        else
          {
          propContent = consistent.second;
          continue;
          }
        }
      else
        {
        // Implicitly set on target and not set in iface. Can't disagree.
        continue;
        }
      }
    else
      {
      if (ifaceIsSet)
        {
        if (propInitialized)
          {
          std::pair<bool, PropertyType> consistent =
                                    consistentProperty(propContent,
                                                       ifacePropContent, t);
          report += reportEntry;
          report += compatibilityAgree(t, propContent != consistent.second);
          if (!consistent.first)
            {
            std::ostringstream e;
            e << "The INTERFACE_" << p << " property of \""
              << theTarget->GetName() << "\" does\nnot agree with the value "
                "of " << p << " already determined\nfor \""
              << tgt->GetName() << "\".\n";
            cmSystemTools::Error(e.str().c_str());
            break;
            }
          else
            {
            propContent = consistent.second;
            continue;
            }
          }
        else
          {
          report += reportEntry + "(Interface set)\n";
          propContent = ifacePropContent;
          propInitialized = true;
          }
        }
      else
        {
        // Not set. Nothing to agree on.
        continue;
        }
      }
    }

  tgt->ReportPropertyOrigin(p, valueAsString<PropertyType>(propContent),
                            report, compatibilityType(t));
  return propContent;
}